

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

int bcf_get_format_string(bcf_hdr_t *hdr,bcf1_t *line,char *tag,char ***dst,int *ndst)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  char **ppcVar5;
  char *pcVar6;
  ulong uVar7;
  bcf_fmt_t *pbVar8;
  long lVar9;
  long lVar10;
  size_t __size;
  
  uVar3 = bcf_hdr_id2int(hdr,0,tag);
  __size = 0xffffffff;
  if ((((int)uVar3 < 0) || (uVar4 = (hdr->id[0][uVar3].val)->info[2], (~uVar4 & 0xf) == 0)) ||
     (__size = 0xfffffffe, (uVar4 & 0xf0) != 0x30)) goto LAB_00120c75;
  if ((line->unpacked & 8) == 0) {
    bcf_unpack(line,8);
  }
  uVar2 = *(ulong *)&line->field_0x10;
  uVar4 = (uint)(uVar2 >> 0x20) & 0xff;
  if ((uVar2 & 0xff00000000) == 0) {
    uVar7 = 0;
  }
  else {
    pbVar8 = (line->d).fmt;
    uVar7 = 0;
    do {
      if (pbVar8->id == uVar3) goto LAB_00120bae;
      uVar7 = uVar7 + 1;
      pbVar8 = pbVar8 + 1;
    } while ((uVar2 >> 0x20 & 0xff) != uVar7);
    uVar7 = (ulong)uVar4;
  }
LAB_00120bae:
  __size = 0xfffffffd;
  if ((uint)uVar7 == uVar4) goto LAB_00120c75;
  uVar7 = uVar7 & 0xffffffff;
  iVar1 = hdr->n[2];
  lVar10 = (long)iVar1;
  pbVar8 = (line->d).fmt;
  if (*dst == (char **)0x0) {
    ppcVar5 = (char **)malloc(lVar10 * 8);
    *dst = ppcVar5;
    if (ppcVar5 != (char **)0x0) {
      *ppcVar5 = (char *)0x0;
      goto LAB_00120bf4;
    }
LAB_00120c6f:
    __size = 0xfffffffc;
  }
  else {
LAB_00120bf4:
    __size = ((long)pbVar8[uVar7].n + 1) * lVar10;
    if (*ndst < (int)__size) {
      pcVar6 = (char *)realloc(**dst,__size);
      **dst = pcVar6;
      if (**dst == (char *)0x0) goto LAB_00120c6f;
      *ndst = (int)__size;
    }
    if (0 < iVar1) {
      lVar9 = 0;
      do {
        iVar1 = pbVar8[uVar7].n;
        pcVar6 = **dst + (iVar1 + 1) * (int)lVar9;
        memcpy(pcVar6,pbVar8[uVar7].p + iVar1 * (int)lVar9,(long)iVar1);
        pcVar6[pbVar8[uVar7].n] = '\0';
        (*dst)[lVar9] = pcVar6;
        lVar9 = lVar9 + 1;
      } while (lVar10 != lVar9);
    }
  }
LAB_00120c75:
  return (int)__size;
}

Assistant:

int bcf_get_format_string(const bcf_hdr_t *hdr, bcf1_t *line, const char *tag, char ***dst, int *ndst)
{
    int i,tag_id = bcf_hdr_id2int(hdr, BCF_DT_ID, tag);
    if ( !bcf_hdr_idinfo_exists(hdr,BCF_HL_FMT,tag_id) ) return -1;    // no such FORMAT field in the header
    if ( bcf_hdr_id2type(hdr,BCF_HL_FMT,tag_id)!=BCF_HT_STR ) return -2;     // expected different type

    if ( !(line->unpacked & BCF_UN_FMT) ) bcf_unpack(line, BCF_UN_FMT);

    for (i=0; i<line->n_fmt; i++)
        if ( line->d.fmt[i].id==tag_id ) break;
    if ( i==line->n_fmt ) return -3;                               // the tag is not present in this record
    bcf_fmt_t *fmt = &line->d.fmt[i];

    int nsmpl = bcf_hdr_nsamples(hdr);
    if ( !*dst )
    {
        *dst = (char**) malloc(sizeof(char*)*nsmpl);
        if ( !*dst ) return -4;     // could not alloc
        (*dst)[0] = NULL;
    }
    int n = (fmt->n+1)*nsmpl;
    if ( *ndst < n )
    {
        (*dst)[0] = realloc((*dst)[0], n);
        if ( !(*dst)[0] ) return -4;    // could not alloc
        *ndst = n;
    }
    for (i=0; i<nsmpl; i++)
    {
        uint8_t *src = fmt->p + i*fmt->n;
        uint8_t *tmp = (uint8_t*)(*dst)[0] + i*(fmt->n+1);
        memcpy(tmp,src,fmt->n);
        tmp[fmt->n] = 0;
        (*dst)[i] = (char*) tmp;
    }
    return n;
}